

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_file.cpp
# Opt level: O0

void Omega_h::binary::read_tag
               (istream *stream,Mesh *mesh,Int d,bool is_compressed,I32 version,bool needs_swapping)

{
  Read<double> local_138;
  undefined1 local_128 [8];
  Read<double> array_3;
  undefined1 local_108 [8];
  Read<long> array_2;
  undefined1 local_e8 [8];
  Read<int> array_1;
  undefined1 local_c8 [8];
  Read<signed_char> array;
  I8 outflags_i8;
  I8 xfer_i8;
  I8 type;
  I8 ncomps;
  string local_a8 [8];
  string name;
  bool needs_swapping_local;
  I32 version_local;
  bool is_compressed_local;
  Int d_local;
  Mesh *mesh_local;
  istream *stream_local;
  
  std::__cxx11::string::string(local_a8);
  read((int)stream,local_a8,(ulong)(needs_swapping & 1));
  read_value<signed_char>
            (stream,(char *)((long)&array.write_.shared_alloc_.direct_ptr + 3),needs_swapping);
  read_value<signed_char>
            (stream,(char *)((long)&array.write_.shared_alloc_.direct_ptr + 2),needs_swapping);
  if ((version < 5) &&
     (read_value<signed_char>
                (stream,(char *)((long)&array.write_.shared_alloc_.direct_ptr + 1),needs_swapping),
     1 < version)) {
    read_value<signed_char>(stream,(char *)&array.write_.shared_alloc_.direct_ptr,needs_swapping);
  }
  if (array.write_.shared_alloc_.direct_ptr._2_1_ == '\0') {
    local_c8 = (undefined1  [8])0x0;
    array.write_.shared_alloc_.alloc = (Alloc *)0x0;
    read_array<signed_char>(stream,(Read<signed_char> *)local_c8,is_compressed,needs_swapping);
    Read<signed_char>::Read
              ((Read<signed_char> *)&array_1.write_.shared_alloc_.direct_ptr,
               (Read<signed_char> *)local_c8);
    Omega_h::Mesh::add_tag<signed_char>
              (mesh,d,(string *)local_a8,(int)array.write_.shared_alloc_.direct_ptr._3_1_,
               (Read<signed_char> *)&array_1.write_.shared_alloc_.direct_ptr,true);
    Read<signed_char>::~Read((Read<signed_char> *)&array_1.write_.shared_alloc_.direct_ptr);
    Read<signed_char>::~Read((Read<signed_char> *)local_c8);
  }
  else if (array.write_.shared_alloc_.direct_ptr._2_1_ == '\x02') {
    local_e8 = (undefined1  [8])0x0;
    array_1.write_.shared_alloc_.alloc = (Alloc *)0x0;
    read_array<int>(stream,(Read<int> *)local_e8,is_compressed,needs_swapping);
    Read<int>::Read((Read<int> *)&array_2.write_.shared_alloc_.direct_ptr,(Read<int> *)local_e8);
    Omega_h::Mesh::add_tag<int>
              (mesh,d,(string *)local_a8,(int)array.write_.shared_alloc_.direct_ptr._3_1_,
               (Read<int> *)&array_2.write_.shared_alloc_.direct_ptr,true);
    Read<int>::~Read((Read<int> *)&array_2.write_.shared_alloc_.direct_ptr);
    Read<int>::~Read((Read<int> *)local_e8);
  }
  else if (array.write_.shared_alloc_.direct_ptr._2_1_ == '\x03') {
    local_108 = (undefined1  [8])0x0;
    array_2.write_.shared_alloc_.alloc = (Alloc *)0x0;
    read_array<long>(stream,(Read<long> *)local_108,is_compressed,needs_swapping);
    Read<long>::Read((Read<long> *)&array_3.write_.shared_alloc_.direct_ptr,(Read<int> *)local_108);
    Omega_h::Mesh::add_tag<long>
              (mesh,d,(string *)local_a8,(int)array.write_.shared_alloc_.direct_ptr._3_1_,
               (Read<long> *)&array_3.write_.shared_alloc_.direct_ptr,true);
    Read<long>::~Read((Read<long> *)&array_3.write_.shared_alloc_.direct_ptr);
    Read<long>::~Read((Read<long> *)local_108);
  }
  else {
    if (array.write_.shared_alloc_.direct_ptr._2_1_ != '\x05') {
      fail("unexpected tag type in binary read\n");
    }
    local_128 = (undefined1  [8])0x0;
    array_3.write_.shared_alloc_.alloc = (Alloc *)0x0;
    read_array<double>(stream,(Read<double> *)local_128,is_compressed,needs_swapping);
    Read<double>::Read(&local_138,(Read<double> *)local_128);
    Omega_h::Mesh::add_tag<double>
              (mesh,d,(string *)local_a8,(int)array.write_.shared_alloc_.direct_ptr._3_1_,&local_138
               ,true);
    Read<double>::~Read(&local_138);
    Read<double>::~Read((Read<double> *)local_128);
  }
  std::__cxx11::string::~string(local_a8);
  return;
}

Assistant:

static void read_tag(std::istream& stream, Mesh* mesh, Int d,
    bool is_compressed, I32 version, bool needs_swapping) {
  std::string name;
  read(stream, name, needs_swapping);
  I8 ncomps;
  read_value(stream, ncomps, needs_swapping);
  I8 type;
  read_value(stream, type, needs_swapping);
  if (version < 5) {
    I8 xfer_i8;
    read_value(stream, xfer_i8, needs_swapping);
    if (2 <= version) {
      I8 outflags_i8;
      read_value(stream, outflags_i8, needs_swapping);
    }
  }
  if (type == OMEGA_H_I8) {
    Read<I8> array;
    read_array(stream, array, is_compressed, needs_swapping);
    mesh->add_tag(d, name, ncomps, array, true);
  } else if (type == OMEGA_H_I32) {
    Read<I32> array;
    read_array(stream, array, is_compressed, needs_swapping);
    mesh->add_tag(d, name, ncomps, array, true);
  } else if (type == OMEGA_H_I64) {
    Read<I64> array;
    read_array(stream, array, is_compressed, needs_swapping);
    mesh->add_tag(d, name, ncomps, array, true);
  } else if (type == OMEGA_H_F64) {
    Read<Real> array;
    read_array(stream, array, is_compressed, needs_swapping);
    mesh->add_tag(d, name, ncomps, array, true);
  } else {
    Omega_h_fail("unexpected tag type in binary read\n");
  }
}